

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

cave_profile * find_cave_profile(char *name)

{
  int iVar1;
  cave_profile *pcVar2;
  cave_profile *profile;
  wchar_t i;
  char *name_local;
  
  profile._4_4_ = 0;
  while( true ) {
    if ((int)(uint)z_info->profile_max <= profile._4_4_) {
      return (cave_profile *)0x0;
    }
    pcVar2 = cave_profiles + profile._4_4_;
    iVar1 = strcmp(name,pcVar2->name);
    if (iVar1 == 0) break;
    profile._4_4_ = profile._4_4_ + 1;
  }
  return pcVar2;
}

Assistant:

static const struct cave_profile *find_cave_profile(const char *name)
{
	int i;

	for (i = 0; i < z_info->profile_max; i++) {
		const struct cave_profile *profile;

		profile = &cave_profiles[i];
		if (streq(name, profile->name))
			return profile;
	}

	/* Not there */
	return NULL;
}